

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  cmake *pcVar4;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> this_00;
  bool bVar5;
  uint uVar6;
  CURLcode CVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  CURL_conflict *data;
  long lVar12;
  cmCTestScriptHandler *pcVar13;
  cmValue source;
  unsigned_long uVar14;
  FILE *__stream;
  string *psVar15;
  long lVar16;
  byte bVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  undefined8 uVar18;
  string *arg;
  int iVar19;
  pointer pbVar20;
  string_view arg_00;
  Curl_easy *in_stack_fffffffffffff828;
  allocator<char> local_7b9;
  string retryDelay;
  cmCTestSubmitHandlerVectorOfChar chunk;
  byte local_760;
  curl_slist *local_750;
  string local_748;
  string retryCount;
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  string upload_as;
  string local_file;
  string remote_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream cmCTestLog_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_630 [22];
  string ofile;
  string curlopt;
  _Vector_base<char,_std::allocator<char>_> local_488;
  _Vector_base<char,_std::allocator<char>_> local_470;
  string local_458;
  char error_buffer [1024];
  
  local_750 = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  pbVar1 = (this->HttpHeaders).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar20 = (this->HttpHeaders).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar1; pbVar20 = pbVar20 + 1
      ) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Add HTTP Header: \"");
    poVar11 = std::operator<<(poVar11,(string *)pbVar20);
    poVar11 = std::operator<<(poVar11,"\"");
    std::endl<char,std::char_traits<char>>(poVar11);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x9c,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&retryDelay);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    local_750 = curl_slist_append(local_750,(pbVar20->_M_dataplus)._M_p);
  }
  curl_global_init(3);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CurlOptions",(allocator<char> *)&retryDelay);
  cmCTest::GetCTestConfiguration(&curlopt,pcVar2,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  arg_00._M_str = curlopt._M_dataplus._M_p;
  arg_00._M_len = curlopt._M_string_length;
  cmExpandedList_abi_cxx11_(&args,arg_00,false);
  local_760 = 0;
  bVar17 = 0;
  for (; args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    bVar5 = std::operator==(args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"CURLOPT_SSL_VERIFYPEER_OFF");
    bVar17 = bVar17 | bVar5;
    bVar5 = std::operator==(args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"CURLOPT_SSL_VERIFYHOST_OFF");
    local_760 = local_760 | bVar5;
  }
  args_00 = (files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (args_00 == pbVar3) {
      curl_slist_free_all(local_750);
      curl_global_cleanup();
LAB_0019b74a:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args);
      std::__cxx11::string::~string((string *)&curlopt);
      return args_00 == pbVar3;
    }
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      _cmCTestLog_msg = (pointer)local_630;
      local_630[0]._M_local_buf[0] = '\0';
      cmCurlSetCAInfo(&local_458,data,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if (bVar17 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator<<((ostream *)&cmCTestLog_msg,"  Set CURLOPT_SSL_VERIFYPEER to off\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xb6,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
      }
      if (local_760 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator<<((ostream *)&cmCTestLog_msg,"  Set CURLOPT_SSL_VERIFYHOST to off\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xbc,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYHOST,0);
      }
      if (0 < this->HTTPProxyType) {
        curl_easy_setopt(data,CURLOPT_PROXY,(this->HTTPProxy)._M_dataplus._M_p);
        uVar18 = 4;
        if (this->HTTPProxyType != 2) {
          if (this->HTTPProxyType != 3) {
            curl_easy_setopt(data,CURLOPT_PROXYTYPE,0);
            if ((this->HTTPProxyAuth)._M_string_length != 0) {
              curl_easy_setopt(data,CURLOPT_PROXYUSERPWD,(this->HTTPProxyAuth)._M_dataplus._M_p);
            }
            goto LAB_0019a473;
          }
          uVar18 = 5;
        }
        curl_easy_setopt(data,CURLOPT_PROXYTYPE,uVar18);
      }
LAB_0019a473:
      bVar5 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
      if (bVar5) {
        curl_easy_setopt(data,CURLOPT_HTTP_VERSION,1);
      }
      curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      curl_easy_setopt(data,CURLOPT_UPLOAD,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
      uVar6 = GetSubmitInactivityTimeout(this);
      if (uVar6 != 0) {
        curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,(ulong)uVar6);
      }
      curl_easy_setopt(data,CURLOPT_PUT,1);
      curl_easy_setopt(data,CURLOPT_VERBOSE,1);
      curl_easy_setopt(data,CURLOPT_HTTPHEADER,local_750);
      std::__cxx11::string::string((string *)&local_file,(string *)args_00);
      bVar5 = cmsys::SystemTools::FileExists(&local_file);
      if (!bVar5) {
        _cmCTestLog_msg = (pointer)localprefix->_M_string_length;
        retryDelay._M_dataplus._M_p = &DAT_00000001;
        retryDelay._M_string_length =
             (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
        cmStrCat<std::__cxx11::string>
                  (&remote_file,(cmAlphaNum *)&cmCTestLog_msg,(cmAlphaNum *)&retryDelay,args_00);
        std::__cxx11::string::operator=((string *)&local_file,(string *)&remote_file);
        std::__cxx11::string::~string((string *)&remote_file);
      }
      cmsys::SystemTools::GetFilenameName((string *)&cmCTestLog_msg,args_00);
      std::operator+(&remote_file,remoteprefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      poVar11 = std::operator<<(this->LogFile,"\tUpload file: ");
      poVar11 = std::operator<<(poVar11,(string *)&local_file);
      poVar11 = std::operator<<(poVar11," to ");
      poVar11 = std::operator<<(poVar11,(string *)&remote_file);
      std::endl<char,std::char_traits<char>>(poVar11);
      cmSystemTools::EncodeURL(&ofile,&remote_file,true);
      _cmCTestLog_msg = (pointer)url->_M_string_length;
      lVar12 = std::__cxx11::string::find((char)url,0x3f);
      retryDelay.field_2._M_local_buf[0] = '&';
      if (lVar12 == -1) {
        retryDelay.field_2._M_local_buf[0] = '?';
      }
      retryDelay._M_dataplus._M_p = &DAT_00000001;
      retryDelay._M_string_length = (size_type)&retryDelay.field_2;
      cmStrCat<char[10],std::__cxx11::string>
                (&upload_as,(cmAlphaNum *)&cmCTestLog_msg,(cmAlphaNum *)&retryDelay,
                 (char (*) [10])"FileName=",&ofile);
      if (!bVar5) {
        cmCTestCurl::cmCTestCurl
                  ((cmCTestCurl *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::append((char *)&upload_as);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_748,"BuildName",(allocator<char> *)&chunk);
        cmCTest::GetCTestConfiguration(&retryCount,pcVar2,&local_748);
        cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::~string((string *)&local_748);
        std::__cxx11::string::append((char *)&upload_as);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_748,"Site",(allocator<char> *)&chunk);
        cmCTest::GetCTestConfiguration(&retryCount,pcVar2,&local_748);
        cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::~string((string *)&local_748);
        std::__cxx11::string::append((char *)&upload_as);
        cmCTest::GetCurrentTag_abi_cxx11_(&retryCount,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::append((char *)&upload_as);
        cmCTest::GetTestModelString_abi_cxx11_
                  (&retryCount,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,&retryCount);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::string::~string((string *)&retryCount);
        pcVar13 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
        pcVar4 = (pcVar13->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
                 _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
        if (pcVar4 != (cmake *)0x0) {
          this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
          super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
               (pcVar4->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&retryDelay,"SubProject",(allocator<char> *)&retryCount);
          source = cmState::GetGlobalProperty
                             ((cmState *)
                              this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                              _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                              super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&retryDelay);
          std::__cxx11::string::~string((string *)&retryDelay);
          if (source.Value != (string *)0x0) {
            std::__cxx11::string::append((char *)&upload_as);
            cmCTestCurl::Escape(&retryDelay,(cmCTestCurl *)&cmCTestLog_msg,source.Value);
            std::__cxx11::string::append((string *)&upload_as);
            std::__cxx11::string::~string((string *)&retryDelay);
          }
        }
        cmCTestCurl::~cmCTestCurl((cmCTestCurl *)&cmCTestLog_msg);
      }
      bVar5 = std::operator==(args_00,"Done.xml");
      if (bVar5) {
        cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
      }
      std::__cxx11::string::append((char *)&upload_as);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg,"InternalTest",(allocator<char> *)&retryDelay);
      cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg)
      ;
      bVar5 = cmIsOn((cmValue)0x19a9a6);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if (bVar5) {
        std::__cxx11::string::append((char *)&upload_as);
      }
      else {
        cmSystemTools::ComputeFileHash((string *)&cmCTestLog_msg,&local_file,AlgoMD5);
        std::__cxx11::string::append((string *)&upload_as);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      }
      bVar5 = cmsys::SystemTools::FileExists(&local_file);
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Cannot find file: ");
        poVar11 = std::operator<<(poVar11,(string *)&local_file);
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x12a,retryDelay._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        curl_easy_cleanup(in_stack_fffffffffffff828);
        curl_slist_free_all(local_750);
        curl_global_cleanup();
        std::__cxx11::string::~string((string *)&upload_as);
        std::__cxx11::string::~string((string *)&ofile);
        std::__cxx11::string::~string((string *)&remote_file);
        std::__cxx11::string::~string((string *)&local_file);
        goto LAB_0019b74a;
      }
      uVar14 = cmsys::SystemTools::FileLength(&local_file);
      __stream = (FILE *)cmsys::SystemTools::Fopen(&local_file,"rb");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Upload file: ");
      poVar11 = std::operator<<(poVar11,(string *)&local_file);
      poVar11 = std::operator<<(poVar11," to ");
      poVar11 = std::operator<<(poVar11,(string *)&upload_as);
      poVar11 = std::operator<<(poVar11," Size: ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x137,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&retryDelay);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      curl_easy_setopt(data,CURLOPT_URL,upload_as._M_dataplus._M_p);
      curl_easy_setopt(data,CURLOPT_HTTPAUTH,0xffffffffffffffef);
      curl_easy_setopt(data,CURLOPT_READDATA,__stream);
      curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar14);
      curl_easy_setopt(data,CURLOPT_ERRORBUFFER,error_buffer);
      curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
      curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
      chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      curl_easy_setopt(data,CURLOPT_WRITEDATA,&chunk);
      curl_easy_setopt(data,CURLOPT_DEBUGDATA,&chunkDebug);
      CVar7 = curl_easy_perform(data);
      if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL output: [");
        retryDelay._M_string_length =
             (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        retryDelay._M_dataplus._M_p =
             chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
        poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&retryDelay);
        poVar11 = std::operator<<(poVar11,"]");
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x15d,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_470,&chunk);
        ParseResponse(this,(cmCTestSubmitHandlerVectorOfChar *)&local_470);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_470);
      }
      if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start !=
          chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL debug output: [");
        retryDelay._M_string_length =
             (long)chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        retryDelay._M_dataplus._M_p =
             chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&retryDelay);
        poVar11 = std::operator<<(poVar11,"]");
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x166,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      if ((CVar7 != CURLE_OK) || (bVar5 = true, this->HasErrors == true)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg,"RetryDelay",(allocator<char> *)&retryCount);
        psVar15 = (string *)
                  cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
        if (psVar15 == (string *)0x0) {
          psVar15 = &cmValue::Empty_abi_cxx11_;
        }
        std::__cxx11::string::string((string *)&retryDelay,(string *)psVar15);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg,"RetryCount",(allocator<char> *)&local_748);
        psVar15 = (string *)
                  cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
        if (psVar15 == (string *)0x0) {
          psVar15 = &cmValue::Empty_abi_cxx11_;
        }
        std::__cxx11::string::string((string *)&retryCount,(string *)psVar15);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        if (retryDelay._M_string_length == 0) {
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_748,"CTestSubmitRetryDelay",&local_7b9);
          cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg,pcVar2,&local_748);
          iVar8 = atoi(_cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_748);
        }
        else {
          iVar8 = atoi(retryDelay._M_dataplus._M_p);
        }
        if (retryCount._M_string_length == 0) {
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_748,"CTestSubmitRetryCount",&local_7b9);
          cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg,pcVar2,&local_748);
          iVar9 = atoi(_cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_748);
        }
        else {
          iVar9 = atoi(retryCount._M_dataplus._M_p);
        }
        iVar19 = 0;
        iVar10 = 0;
        if (0 < iVar9) {
          iVar10 = iVar9;
        }
        do {
          if (iVar19 == iVar10) goto LAB_0019b2a7;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          std::operator<<((ostream *)&cmCTestLog_msg,"   Submit failed, waiting ");
          poVar11 = std::ostream::_M_insert<double>((double)iVar8);
          std::operator<<(poVar11," seconds...\n");
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x17d,local_748._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_748);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          lVar12 = std::chrono::_V2::steady_clock::now();
          while (lVar16 = std::chrono::_V2::steady_clock::now(),
                (double)lVar16 < (double)lVar12 + (double)iVar8 * 1000000000.0) {
            cmsys::SystemTools::Delay(100);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Retry submission: Attempt ");
          iVar19 = iVar19 + 1;
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar19);
          poVar11 = std::operator<<(poVar11," of ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar9);
          std::endl<char,std::char_traits<char>>(poVar11);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x187,local_748._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_748);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          fclose(__stream);
          __stream = (FILE *)cmsys::SystemTools::Fopen(&local_file,"rb");
          curl_easy_setopt(data,CURLOPT_READDATA,__stream);
          if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish !=
              chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start) {
            chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish = chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          }
          if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          this->HasErrors = false;
          CVar7 = curl_easy_perform(data);
          if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start !=
              chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL output: [");
            local_748._M_string_length =
                 (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_748._M_dataplus._M_p =
                 chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&local_748);
            poVar11 = std::operator<<(poVar11,"]");
            std::endl<char,std::char_traits<char>>(poVar11);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x198,local_748._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                        );
            std::__cxx11::string::~string((string *)&local_748);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)&local_488,&chunk);
            ParseResponse(this,(cmCTestSubmitHandlerVectorOfChar *)&local_488);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_488);
          }
        } while ((CVar7 != CURLE_OK) || (this->HasErrors != false));
        CVar7 = CURLE_OK;
LAB_0019b2a7:
        std::__cxx11::string::~string((string *)&retryCount);
        std::__cxx11::string::~string((string *)&retryDelay);
        bVar5 = CVar7 == CURLE_OK;
      }
      fclose(__stream);
      if (bVar5) {
        curl_easy_cleanup(in_stack_fffffffffffff828);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator+(&retryDelay,"   Uploaded: ",&local_file);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&retryDelay);
        std::endl<char,std::char_traits<char>>(poVar11);
        std::__cxx11::string::~string((string *)&retryDelay);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1c0,retryDelay._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Error when uploading file: ");
        poVar11 = std::operator<<(poVar11,(string *)&local_file);
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1a6,retryDelay._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"   Error message was: ");
        poVar11 = std::operator<<(poVar11,error_buffer);
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1a8,retryDelay._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&retryDelay);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar11 = std::operator<<(this->LogFile,"   Error when uploading file: ");
        poVar11 = std::operator<<(poVar11,(string *)&local_file);
        poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<(poVar11,"   Error message was: ");
        poVar11 = std::operator<<(poVar11,error_buffer);
        std::endl<char,std::char_traits<char>>(poVar11);
        if (chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          poVar11 = std::operator<<(this->LogFile,"   Curl output was: ");
          _cmCTestLog_msg =
               chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start;
          poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&cmCTestLog_msg);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar11 = std::operator<<((ostream *)&cmCTestLog_msg,"CURL output: [");
          retryDelay._M_string_length =
               (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          retryDelay._M_dataplus._M_p =
               chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start;
          poVar11 = ::operator<<(poVar11,(cmCTestLogWrite *)&retryDelay);
          poVar11 = std::operator<<(poVar11,"]");
          std::endl<char,std::char_traits<char>>(poVar11);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1b5,retryDelay._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&retryDelay);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        }
        curl_easy_cleanup(in_stack_fffffffffffff828);
        curl_slist_free_all(local_750);
        curl_global_cleanup();
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&chunkDebug.super__Vector_base<char,_std::allocator<char>_>);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&chunk.super__Vector_base<char,_std::allocator<char>_>);
      std::__cxx11::string::~string((string *)&upload_as);
      std::__cxx11::string::~string((string *)&ofile);
      std::__cxx11::string::~string((string *)&remote_file);
      std::__cxx11::string::~string((string *)&local_file);
      if (!bVar5) goto LAB_0019b74a;
    }
    args_00 = args_00 + 1;
  } while( true );
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  CURLcode res;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args = cmExpandedList(curlopt);
  bool verifyPeerOff = false;
  bool verifyHostOff = false;
  for (std::string const& arg : args) {
    if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
      verifyPeerOff = true;
    }
    if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
      verifyHostOff = true;
    }
  }
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (verifyPeerOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
      }
      if (verifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      // enable HTTP ERROR parsing
      curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
      if (submitInactivityTimeout != 0) {
        ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                           submitInactivityTimeout);
      }

      /* HTTP PUT please */
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = cmStrCat(localprefix, "/", file);
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as =
        cmStrCat(url, ((url.find('?') == std::string::npos) ? '?' : '&'),
                 "FileName=", ofile);

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(*subproject);
          }
        }
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      upload_as += "&MD5=";

      if (cmIsOn(this->GetOption("InternalTest"))) {
        upload_as += "bad_md5sum";
      } else {
        upload_as +=
          cmSystemTools::ComputeFileHash(local_file, cmCryptoHash::AlgoMD5);
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      res = ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      if (res != CURLE_OK || this->HasErrors) {
        std::string retryDelay = *this->GetOption("RetryDelay");
        std::string retryCount = *this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          res = ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          if (res == CURLE_OK && !this->HasErrors) {
            break;
          }
        }
      }

      fclose(ftpfile);
      if (res) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}